

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O0

bool __thiscall spvtools::opt::anon_unknown_0::LoopUnswitch::CanUnswitchLoop(LoopUnswitch *this)

{
  bool bVar1;
  Op OVar2;
  CFG *this_00;
  BasicBlockListTy *this_01;
  reference pvVar3;
  BasicBlock *this_02;
  BasicBlock *pBVar4;
  Instruction *pIVar5;
  BasicBlock *bb;
  _Node_iterator_base<unsigned_int,_false> _Stack_38;
  uint32_t bb_id;
  const_iterator __end3;
  const_iterator __begin3;
  BasicBlockListTy *__range3;
  CFG *cfg;
  LoopUnswitch *this_local;
  
  if (this->switch_block_ == (BasicBlock *)0x0) {
    bVar1 = Loop::IsSafeToClone(this->loop_);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      this_00 = IRContext::cfg(this->context_);
      this_01 = Loop::GetBlocks(this->loop_);
      __end3 = std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::begin(this_01);
      _Stack_38._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::end(this_01);
      while (bVar1 = std::__detail::operator!=
                               (&__end3.super__Node_iterator_base<unsigned_int,_false>,
                                &stack0xffffffffffffffc8), bVar1) {
        pvVar3 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end3);
        this_02 = CFG::block(this_00,*pvVar3);
        pBVar4 = Loop::GetLatchBlock(this->loop_);
        if (pBVar4 != this_02) {
          pIVar5 = BasicBlock::terminator(this_02);
          bVar1 = Instruction::IsBranch(pIVar5);
          if (bVar1) {
            pIVar5 = BasicBlock::terminator(this_02);
            OVar2 = Instruction::opcode(pIVar5);
            if (OVar2 != OpBranch) {
              pIVar5 = BasicBlock::terminator(this_02);
              bVar1 = IsConditionNonConstantLoopInvariant(this,pIVar5);
              if (bVar1) {
                this->switch_block_ = this_02;
                break;
              }
            }
          }
        }
        std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end3);
      }
      this_local._7_1_ = this->switch_block_ != (BasicBlock *)0x0;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CanUnswitchLoop() {
    if (switch_block_) return true;
    if (loop_->IsSafeToClone()) return false;

    CFG& cfg = *context_->cfg();

    for (uint32_t bb_id : loop_->GetBlocks()) {
      BasicBlock* bb = cfg.block(bb_id);
      if (loop_->GetLatchBlock() == bb) {
        continue;
      }

      if (bb->terminator()->IsBranch() &&
          bb->terminator()->opcode() != spv::Op::OpBranch) {
        if (IsConditionNonConstantLoopInvariant(bb->terminator())) {
          switch_block_ = bb;
          break;
        }
      }
    }

    return switch_block_;
  }